

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int common(PROLOG_STATE *state,int tok)

{
  int tok_local;
  PROLOG_STATE *state_local;
  
  if ((state->documentEntity == 0) && (tok == 0x1c)) {
    state_local._4_4_ = 0x34;
  }
  else {
    state->handler = error;
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

static
int common(PROLOG_STATE *state, int tok)
{
#ifdef XML_DTD
  if (!state->documentEntity && tok == XML_TOK_PARAM_ENTITY_REF)
    return XML_ROLE_INNER_PARAM_ENTITY_REF;
#endif
  state->handler = error;
  return XML_ROLE_ERROR;
}